

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPF.cpp
# Opt level: O3

void __thiscall
OpenMD::RNEMD::SPFMethod::SPFMethod(SPFMethod *this,SimInfo *info,ForceManager *forceMan)

{
  SelectionEvaluator *this_00;
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  RNEMDFluxType RVar5;
  RNEMDParameters *pRVar6;
  MoleculeStamp *pMVar7;
  pointer pcVar8;
  RealType RVar9;
  double dVar10;
  SPFForceManager *pSVar11;
  Molecule *this_01;
  pointer ppMVar12;
  long *plVar13;
  pointer ppMVar14;
  size_type *psVar15;
  ulong uVar16;
  long lVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  string ionStr;
  MoleculeIterator i;
  vector<double,_std::allocator<double>_> q_tot;
  vector<int,_std::allocator<int>_> molCount;
  SelectionManager ionManager;
  SelectionEvaluator ionEvaluator;
  string local_6e0;
  MoleculeIterator local_6c0;
  vector<double,_std::allocator<double>_> local_6b8;
  vector<int,_std::allocator<int>_> local_6a0;
  long *local_688 [2];
  long local_678 [2];
  SelectionManager *local_668;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_660;
  SelectionManager *local_658;
  SelectionManager *local_650;
  SelectionManager local_648;
  SelectionEvaluator local_580;
  
  RNEMD::RNEMD(&this->super_RNEMD,info,forceMan);
  (this->super_RNEMD)._vptr_RNEMD = (_func_int **)&PTR__SPFMethod_003019a0;
  this->spfTarget_ = 0.0;
  SelectionManager::SelectionManager(&this->smanA_,info);
  SelectionManager::SelectionManager(&this->smanB_,info);
  local_650 = &this->anionMan_;
  SelectionManager::SelectionManager(local_650,info);
  local_658 = &this->cationMan_;
  SelectionManager::SelectionManager(local_658,info);
  this->forceManager_ = (SPFForceManager *)0x0;
  local_660 = &(this->selectedMoleculeStr_).field_2;
  (this->selectedMoleculeStr_)._M_dataplus._M_p = (pointer)local_660;
  (this->selectedMoleculeStr_)._M_string_length = 0;
  (this->selectedMoleculeStr_).field_2._M_local_buf[0] = '\0';
  this_00 = &this->selectedMoleculeEvaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  local_668 = &this->selectedMoleculeMan_;
  SelectionManager::SelectionManager(local_668,info);
  this->failedLastTrial_ = false;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_RNEMD).rnemdMethodLabel_,0,
             (char *)(this->super_RNEMD).rnemdMethodLabel_._M_string_length,0x29beb4);
  std::__cxx11::string::_M_replace
            ((ulong)&this->selectedMoleculeStr_,0,
             (char *)(this->selectedMoleculeStr_)._M_string_length,0x29f094);
  SelectionEvaluator::loadScriptString(this_00,&this->selectedMoleculeStr_);
  SelectionEvaluator::evaluate((SelectionSet *)&local_580,this_00);
  lVar17 = 0;
  do {
    std::vector<bool,_std::allocator<bool>_>::operator=
              ((vector<bool,_std::allocator<bool>_> *)
               ((long)&(((this->selectedMoleculeMan_).ss_.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                       super__Bvector_base<std::allocator<bool>_> + lVar17),
               (vector<bool,_std::allocator<bool>_> *)
               (local_580.compiler.filename._M_dataplus._M_p + lVar17));
    lVar17 = lVar17 + 0x28;
  } while (lVar17 != 0xf0);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_580);
  if ((forceMan == (ForceManager *)0x0) ||
     (pSVar11 = (SPFForceManager *)
                __dynamic_cast(forceMan,&ForceManager::typeinfo,&SPFForceManager::typeinfo,0),
     pSVar11 == (SPFForceManager *)0x0)) {
    builtin_strncpy(painCave.errMsg + 0x30,"anager.\n",9);
    builtin_strncpy(painCave.errMsg + 0x20,"e default ForceM",0x10);
    builtin_strncpy(painCave.errMsg + 0x10," be used with th",0x10);
    builtin_strncpy(painCave.errMsg,"SPF-RNEMD cannot",0x10);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  else {
    this->forceManager_ = pSVar11;
    pSVar11->spfRNEMD_ = this;
  }
  pRVar6 = info->simParams_->rnemdPars_;
  if ((this->super_RNEMD).useChargedSPF_ == true) {
    local_6c0._M_node = (_Base_ptr)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_6b8,
               (long)(this->super_RNEMD).objectTypes_.
                     super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->super_RNEMD).objectTypes_.
                     super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_580);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_6a0,
               (long)(this->super_RNEMD).objectTypes_.
                     super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->super_RNEMD).objectTypes_.
                     super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_580);
    this_01 = SimInfo::beginMolecule((this->super_RNEMD).info_,&local_6c0);
    while( true ) {
      ppMVar12 = (this->super_RNEMD).objectTypes_.
                 super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppMVar14 = (this->super_RNEMD).objectTypes_.
                 super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (this_01 == (Molecule *)0x0) break;
      if (ppMVar14 != ppMVar12) {
        uVar16 = 0;
        do {
          if (ppMVar12[uVar16] == this_01->molStamp_) {
            RVar9 = Molecule::getFixedCharge(this_01);
            local_6b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar16] =
                 RVar9 + local_6b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar16];
            local_6a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar16] =
                 local_6a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar16] + 1;
            ppMVar12 = (this->super_RNEMD).objectTypes_.
                       super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppMVar14 = (this->super_RNEMD).objectTypes_.
                       super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < (ulong)((long)ppMVar14 - (long)ppMVar12 >> 3));
      }
      this_01 = SimInfo::nextMolecule((this->super_RNEMD).info_,&local_6c0);
    }
    if (ppMVar14 != ppMVar12) {
      uVar16 = 0;
      do {
        SelectionEvaluator::SelectionEvaluator(&local_580,info);
        SelectionManager::SelectionManager(&local_648,info);
        pMVar7 = (this->super_RNEMD).objectTypes_.
                 super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar16];
        pcVar8 = (pMVar7->Name).data_._M_dataplus._M_p;
        local_688[0] = local_678;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_688,pcVar8,pcVar8 + (pMVar7->Name).data_._M_string_length);
        plVar13 = (long *)std::__cxx11::string::replace((ulong)local_688,0,(char *)0x0,0x29f0d9);
        local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
        psVar15 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_6e0.field_2._M_allocated_capacity = *psVar15;
          local_6e0.field_2._8_8_ = plVar13[3];
        }
        else {
          local_6e0.field_2._M_allocated_capacity = *psVar15;
          local_6e0._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_6e0._M_string_length = plVar13[1];
        *plVar13 = (long)psVar15;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        if (local_688[0] != local_678) {
          operator_delete(local_688[0],local_678[0] + 1);
        }
        SelectionEvaluator::loadScriptString(&local_580,&local_6e0);
        SelectionEvaluator::evaluate((SelectionSet *)local_688,&local_580);
        lVar17 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&((local_648.ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar17),(vector<bool,_std::allocator<bool>_> *)((long)local_688[0] + lVar17));
          lVar17 = lVar17 + 0x28;
        } while (lVar17 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_688)
        ;
        if (local_6a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar16] < 1) {
          local_6b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar16] = 0.0;
        }
        else {
          dVar10 = local_6b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar16] /
                   (double)local_6a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar16];
          local_6b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar16] = dVar10;
          if (dVar10 <= 0.0) {
            if (dVar10 < 0.0) {
              lVar17 = 0;
              do {
                OpenMDBitSet::orOperator
                          ((OpenMDBitSet *)
                           ((long)&(((this->anionMan_).ss_.bitsets_.
                                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                   super__Bvector_base<std::allocator<bool>_> + lVar17),
                           (OpenMDBitSet *)
                           ((long)&((local_648.ss_.bitsets_.
                                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                   super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           lVar17));
                lVar17 = lVar17 + 0x28;
              } while (lVar17 != 0xf0);
            }
          }
          else {
            lVar17 = 0;
            do {
              OpenMDBitSet::orOperator
                        ((OpenMDBitSet *)
                         ((long)&(((this->cationMan_).ss_.bitsets_.
                                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                 super__Bvector_base<std::allocator<bool>_> + lVar17),
                         (OpenMDBitSet *)
                         ((long)&((local_648.ss_.bitsets_.
                                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                         lVar17));
              lVar17 = lVar17 + 0x28;
            } while (lVar17 != 0xf0);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
          operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
        }
        SelectionManager::~SelectionManager(&local_648);
        SelectionEvaluator::~SelectionEvaluator(&local_580);
        uVar16 = uVar16 + 1;
      } while (uVar16 < (ulong)((long)(this->super_RNEMD).objectTypes_.
                                      super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->super_RNEMD).objectTypes_.
                                      super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (local_6a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_6a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_6a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_6a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_6b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_6b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_6b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_6b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  bVar2 = (pRVar6->KineticFlux).super_ParameterBase.empty_;
  bVar3 = (pRVar6->ParticleFlux).super_ParameterBase.empty_;
  bVar4 = (pRVar6->CurrentDensity).super_ParameterBase.empty_;
  RVar5 = (this->super_RNEMD).rnemdFluxType_;
  if (RVar5 == rnemdParticle) {
    lVar17 = 0x278;
    if (bVar3 != false) goto LAB_002318cb;
  }
  else {
    if (RVar5 == rnemdCurrentDensity) {
      if (bVar4 != false) goto LAB_002318cb;
      lVar17 = 0x278;
      if (bVar3 == false) goto LAB_00231922;
    }
    else {
      if (RVar5 == rnemdParticleKE) {
        if (bVar3 != false || bVar2 != false) goto LAB_002318cb;
      }
      else {
        snprintf(painCave.errMsg,2000,
                 "RNEMD: The current method, SPF\n\tcannot be used with the current flux type, %s\n"
                 ,(this->super_RNEMD).rnemdFluxTypeLabel_._M_dataplus._M_p);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
LAB_002318cb:
        snprintf(painCave.errMsg,2000,
                 "RNEMD: The current method, SPF, and flux type, %s,\n\tdid not have the correct flux type specified. Options\n\tinclude: particleFlux, particleFlux + kineticFlux,\n\tand currentDensity.\n"
                 ,(this->super_RNEMD).rnemdFluxTypeLabel_._M_dataplus._M_p);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      lVar17 = 0x278;
      if (bVar3 == false) goto LAB_00231922;
      uVar18 = 0;
      uVar19 = 0;
      if (bVar4 != false) goto LAB_00231928;
    }
    lVar17 = 0x2b0;
  }
LAB_00231922:
  uVar1 = *(undefined8 *)((long)&(pRVar6->super_DataHolder)._vptr_DataHolder + lVar17);
  uVar18 = (undefined4)uVar1;
  uVar19 = (undefined4)((ulong)uVar1 >> 0x20);
LAB_00231928:
  RNEMD::setParticleFlux(&this->super_RNEMD,(RealType)CONCAT44(uVar19,uVar18));
  uVar18 = 0;
  uVar19 = 0;
  if (bVar2 == false) {
    dVar10 = (pRVar6->KineticFlux).data_;
    uVar18 = SUB84(dVar10,0);
    uVar19 = (undefined4)((ulong)dVar10 >> 0x20);
  }
  RNEMD::setKineticFlux(&this->super_RNEMD,(RealType)CONCAT44(uVar19,uVar18));
  this->uniformKineticScaling_ =
       (bool)(pRVar6->SPFUniformKineticScaling).super_ParameterBase.field_0x2b;
  return;
}

Assistant:

SPFMethod::SPFMethod(SimInfo* info, ForceManager* forceMan) :
      RNEMD {info, forceMan}, smanA_ {info}, smanB_ {info}, anionMan_ {info},
      cationMan_ {info}, selectedMoleculeMan_ {info},
      selectedMoleculeEvaluator_ {info} {
    rnemdMethodLabel_ = "SPF";

    selectedMoleculeStr_ = "select none";
    selectedMoleculeEvaluator_.loadScriptString(selectedMoleculeStr_);
    selectedMoleculeMan_.setSelectionSet(selectedMoleculeEvaluator_.evaluate());

    if (SPFForceManager* spfForceManager =
            dynamic_cast<SPFForceManager*>(forceMan)) {
      forceManager_            = spfForceManager;
      forceManager_->spfRNEMD_ = this;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SPF-RNEMD cannot be used with the default ForceManager.\n");
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    RNEMDParameters* rnemdParams = info->getSimParams()->getRNEMDParameters();

    // Calculate ion fixed charges for use in the Charged-SPF method
    if (useChargedSPF_) {
      SimInfo::MoleculeIterator i;
      Molecule* mol;
      std::vector<RealType> q_tot(objectTypes_.size());
      std::vector<int> molCount(objectTypes_.size());

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (std::size_t i {}; i < objectTypes_.size(); ++i) {
          if (objectTypes_[i] == mol->getMolStamp()) {
            q_tot[i] += mol->getFixedCharge();
            molCount[i]++;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &q_tot[0], q_tot.size(), MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &molCount[0], molCount.size(), MPI_INT,
                    MPI_SUM, MPI_COMM_WORLD);
#endif

      for (std::size_t i {}; i < objectTypes_.size(); ++i) {
        SelectionEvaluator ionEvaluator {info};
        SelectionManager ionManager {info};

        std::string ionStr = "select " + objectTypes_[i]->getName();
        ionEvaluator.loadScriptString(ionStr);
        ionManager.setSelectionSet(ionEvaluator.evaluate());

        if (molCount[i] > 0) {
          q_tot[i] /= molCount[i];

          if (q_tot[i] > 0.0) {
            cationMan_ |= ionManager;
          } else if (q_tot[i] < 0.0) {
            anionMan_ |= ionManager;
          }
        } else {
          q_tot[i] = 0.0;
        }
      }
    }

    bool hasParticleFlux   = rnemdParams->haveParticleFlux();
    bool hasCurrentDensity = rnemdParams->haveCurrentDensity();
    bool hasKineticFlux    = rnemdParams->haveKineticFlux();

    bool methodFluxMismatch = false;
    bool hasCorrectFlux     = false;

    switch (rnemdFluxType_) {
    case rnemdParticle:
      hasCorrectFlux = hasParticleFlux;
      break;
    case rnemdParticleKE:
      hasCorrectFlux = hasParticleFlux && hasKineticFlux;
      break;
    case rnemdCurrentDensity:
      hasCorrectFlux = hasCurrentDensity;
      break;
    default:
      methodFluxMismatch = true;
      break;
    }

    if (methodFluxMismatch) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current method, SPF\n"
               "\tcannot be used with the current flux type, %s\n",
               rnemdFluxTypeLabel_.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (!hasCorrectFlux) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current method, SPF, and flux type, %s,\n"
               "\tdid not have the correct flux type specified. Options\n"
               "\tinclude: particleFlux, particleFlux + kineticFlux,\n"
               "\tand currentDensity.\n",
               rnemdFluxTypeLabel_.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (hasParticleFlux) {
      setParticleFlux(rnemdParams->getParticleFlux());
    } else if (hasCurrentDensity) {
      setParticleFlux(rnemdParams->getCurrentDensity());
    } else {
      setParticleFlux(0.0);
    }

    if (hasKineticFlux) {
      setKineticFlux(rnemdParams->getKineticFlux());
    } else {
      setKineticFlux(0.0);
    }

    uniformKineticScaling_ = rnemdParams->getSPFUniformKineticScaling();
  }